

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O0

void __thiscall CTestGen9Resource_TestCCS_Test::TestBody(CTestGen9Resource_TestCCS_Test *this)

{
  TEST_TILE_TYPE Tile;
  TEST_BPP Bpp_00;
  TEST_RESOURCE_TYPE ResType_00;
  int iVar1;
  int iVar2;
  bool bVar3;
  uint ExpectedValue;
  uint uVar4;
  reference ptVar5;
  TEST_TILE_TYPE *pTVar6;
  TEST_BPP *pTVar7;
  TEST_RESOURCE_TYPE *pTVar8;
  __tuple_element_t<3UL,_tuple<int,_int,_int,_int,_int>_> *p_Var9;
  __tuple_element_t<4UL,_tuple<int,_int,_int,_int,_int>_> *p_Var10;
  long lVar11;
  GMM_RESOURCE_INFO *ResourceInfo;
  int local_1dc;
  int local_1c4;
  uint local_1c0;
  uint32_t ExpectedHeight;
  uint32_t DepthSlice;
  uint32_t ExpectedQPitch;
  uint32_t ExpectedPitch;
  GMM_RESOURCE_INFO *CCSResourceInfo;
  GMM_RESOURCE_INFO *RTResourceInfo;
  int ArrayIdx;
  int TestDimIdx;
  TEST_RESOURCE_TYPE ResType;
  TEST_BPP Bpp;
  TEST_TILE_TYPE Tiling;
  undefined1 local_158 [8];
  GMM_RESCREATE_PARAMS gmmParams;
  tuple<int,_int,_int,_int,_int> element;
  iterator __end1;
  iterator __begin1;
  vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>
  *__range1;
  undefined1 local_90 [4];
  int Size;
  vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>
  List;
  uint32_t ExpectedMCSBpp;
  uint32_t TileSize;
  uint32_t HeightDivisor;
  uint32_t WidthDivisor;
  uint32_t TileDimZ;
  uint32_t TileDimY;
  uint32_t TileDimX;
  uint32_t RTVAlign;
  uint32_t RTHAlign;
  uint32_t TestArraySize [2];
  uint32_t TestDimensions [4] [3];
  uint32_t CCSTileSize [1] [2];
  CTestGen9Resource_TestCCS_Test *this_local;
  
  TestDimensions[3][1] = 0x80;
  TestDimensions[3][2] = 0x20;
  TestDimensions[0][2] = 0;
  TestDimensions[1][0] = 0;
  TestArraySize[0] = 0;
  TestArraySize[1] = 0;
  TestDimensions[0][0] = 0;
  TestDimensions[0][1] = 1;
  TestDimensions[1][1] = 1;
  TestDimensions[1][2] = 1;
  TestDimensions[2][0] = 0;
  TestDimensions[2][1] = 1;
  TestDimensions[2][2] = 1;
  TestDimensions[3][0] = 1;
  _RTVAlign = 0x900000001;
  TileDimX = 0x80;
  TileDimY = 0x40;
  std::
  vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>
  ::vector((vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>
            *)local_90);
  BuildInputIterator((vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>
                      *)local_90,4,2);
  __end1 = std::
           vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>
           ::begin((vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>
                    *)local_90);
  element.super__Tuple_impl<0UL,_int,_int,_int,_int,_int>._12_8_ =
       std::
       vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>
       ::end((vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>
              *)local_90);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::tuple<int,_int,_int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>_>
                                     *)&element.super__Tuple_impl<0UL,_int,_int,_int,_int,_int>.
                                        super__Tuple_impl<1UL,_int,_int,_int,_int>.
                                        super__Head_base<1UL,_int,_false>), bVar3) {
    ptVar5 = __gnu_cxx::
             __normal_iterator<std::tuple<int,_int,_int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>_>
             ::operator*(&__end1);
    unique0x00012000 =
         (ptVar5->super__Tuple_impl<0UL,_int,_int,_int,_int,_int>).
         super__Tuple_impl<1UL,_int,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int,_int>.
         super__Tuple_impl<3UL,_int,_int>;
    element.super__Tuple_impl<0UL,_int,_int,_int,_int,_int>.
    super__Tuple_impl<1UL,_int,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int,_int>.
    super__Tuple_impl<3UL,_int,_int> =
         *(_Tuple_impl<3UL,_int,_int> *)
          &(ptVar5->super__Tuple_impl<0UL,_int,_int,_int,_int,_int>).
           super__Tuple_impl<1UL,_int,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int,_int>.
           super__Head_base<2UL,_int,_false>;
    element.super__Tuple_impl<0UL,_int,_int,_int,_int,_int>.
    super__Tuple_impl<1UL,_int,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int,_int>.
    super__Head_base<2UL,_int,_false>._M_head_impl =
         (ptVar5->super__Tuple_impl<0UL,_int,_int,_int,_int,_int>).super__Head_base<0UL,_int,_false>
         ._M_head_impl;
    memset(local_158,0,0x80);
    _Bpp = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)_Bpp & 0xffff000000000000);
    gmmParams.Flags.Gpu = _Bpp;
    pTVar6 = (TEST_TILE_TYPE *)
             std::get<0ul,int,int,int,int,int>
                       ((tuple<int,_int,_int,_int,_int> *)&gmmParams.MultiTileArch.Reserved);
    Tile = *pTVar6;
    pTVar7 = (TEST_BPP *)
             std::get<1ul,int,int,int,int,int>
                       ((tuple<int,_int,_int,_int,_int> *)&gmmParams.MultiTileArch.Reserved);
    Bpp_00 = *pTVar7;
    pTVar8 = (TEST_RESOURCE_TYPE *)
             std::get<2ul,int,int,int,int,int>
                       ((tuple<int,_int,_int,_int,_int> *)&gmmParams.MultiTileArch.Reserved);
    ResType_00 = *pTVar8;
    p_Var9 = std::get<3ul,int,int,int,int,int>
                       ((tuple<int,_int,_int,_int,_int> *)&gmmParams.MultiTileArch.Reserved);
    iVar1 = *p_Var9;
    p_Var10 = std::get<4ul,int,int,int,int,int>
                        ((tuple<int,_int,_int,_int,_int> *)&gmmParams.MultiTileArch.Reserved);
    iVar2 = *p_Var10;
    if ((1 < (int)Tile) &&
       ((((Bpp_00 == TEST_BPP_32 || (Bpp_00 == TEST_BPP_64)) || (Bpp_00 == TEST_BPP_128)) &&
        ((ResType_00 != TEST_RESOURCE_1D && (ResType_00 != TEST_RESOURCE_BUFFER)))))) {
      CTestResource::SetTileFlag((CTestResource *)this,(GMM_RESCREATE_PARAMS *)local_158,Tile);
      CTestResource::SetResType((CTestResource *)this,(GMM_RESCREATE_PARAMS *)local_158,ResType_00);
      CTestResource::SetResGpuFlags((CTestResource *)this,(GMM_RESCREATE_PARAMS *)local_158,true);
      CTestResource::SetResArraySize
                ((CTestResource *)this,(GMM_RESCREATE_PARAMS *)local_158,(&RTVAlign)[iVar2]);
      gmmParams.ExistingSysMemSize._4_1_ = 1;
      local_158._4_4_ = CTestResource::SetResourceFormat((CTestResource *)this,Bpp_00);
      CTestGen9Resource::GetAlignmentAndTileDimensionsForCCS
                (&this->super_CTestGen9Resource,Bpp_00,Tile,ResType_00,&TileDimZ,&WidthDivisor,
                 &HeightDivisor,&TileSize,&ExpectedMCSBpp);
      local_1c0 = TestDimensions[(long)iVar1 + -1][1] * TileDimZ + 1;
      gmmParams._40_8_ = ZEXT48(local_1c0);
      if (local_158._0_4_ != RESOURCE_CUBE) {
        local_1c0 = TestDimensions[(long)iVar1 + -1][2] * WidthDivisor + 1;
      }
      gmmParams.field_6.BaseWidth = local_1c0;
      if (local_158._0_4_ == RESOURCE_3D) {
        local_1c4 = TestDimensions[iVar1][0] * HeightDivisor + 1;
      }
      else {
        local_1c4 = 1;
      }
      gmmParams.field_6.BaseWidth64._4_4_ = local_1c4;
      gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x1;
      gmmParams.Type._0_1_ = (undefined1)gmmParams.Type & 0xfd;
      lVar11 = (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                         (CommonULT::pGmmULTClientContext,local_158);
      if (lVar11 != 0) {
        gmmParams.Type._0_1_ = (undefined1)gmmParams.Type | RESOURCE_2D;
        ResourceInfo = (GMM_RESOURCE_INFO *)
                       (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                                 (CommonULT::pGmmULTClientContext,local_158);
        CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,ResourceInfo,TileDimX);
        CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,ResourceInfo,TileDimY);
        ExpectedValue =
             (TestDimensions[3][1] - 1) +
             (int)((gmmParams._40_8_ + (ulong)(TileDimX - 1) & ~(ulong)(TileDimX - 1)) /
                  (ulong)TileSize) & -TestDimensions[3][1];
        CTestResource::VerifyResourcePitch<true>((CTestResource *)this,ResourceInfo,ExpectedValue);
        CTestResource::VerifyResourcePitchInTiles<true>
                  ((CTestResource *)this,ResourceInfo,ExpectedValue / TestDimensions[3][1]);
        local_1dc = gmmParams.field_6.BaseWidth64._4_4_;
        uVar4 = (gmmParams.field_6.BaseWidth + (TileDimY - 1)) -
                (gmmParams.field_6.BaseWidth + (TileDimY - 1) & TileDimY - 1);
        if (((1 < gmmParams.Depth) || (local_158._0_4_ == RESOURCE_CUBE)) ||
           (local_158._0_4_ == RESOURCE_3D)) {
          CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,ResourceInfo,(ulong)uVar4)
          ;
          if (local_158._0_4_ == RESOURCE_3D) {
          }
          else {
            local_1dc = 1;
            if (local_158._0_4_ == RESOURCE_CUBE) {
              local_1dc = 6;
            }
          }
          gmmParams.Depth = local_1dc * gmmParams.Depth;
        }
        CTestResource::VerifyResourceSize<true>
                  ((CTestResource *)this,ResourceInfo,
                   (ulong)(ExpectedValue *
                           ((TestDimensions[3][2] - 1) + (uVar4 / ExpectedMCSBpp) * gmmParams.Depth
                           & -TestDimensions[3][2]) + 0xfff & 0xfffff000));
        (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                  (CommonULT::pGmmULTClientContext,ResourceInfo);
      }
      (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                (CommonULT::pGmmULTClientContext,lVar11);
    }
    __gnu_cxx::
    __normal_iterator<std::tuple<int,_int,_int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>
  ::~vector((vector<std::tuple<int,_int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int,_int>_>_>
             *)local_90);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, TestCCS)
{
    const uint32_t CCSTileSize[1][2] = {128, 32}; //CCS is TileY

    const uint32_t TestDimensions[4][3] = {
    //Input dimensions in #Tiles
    {0, 0, 0}, //1x1x1
    {1, 0, 0}, //2 Tilesx1x1
    {1, 1, 0}, //2 Tilesx 2x1
    {1, 1, 1}, //2 Tilesx 2x2
    };
    uint32_t TestArraySize[2] = {1, 9};

    uint32_t RTHAlign = 128, RTVAlign = 64; //Gen9 CCS's RT should be aligned to 128x64

    uint32_t TileDimX, TileDimY, TileDimZ, WidthDivisor, HeightDivisor, TileSize;
    uint32_t ExpectedMCSBpp;
    std::vector<tuple<int, int, int, int, int>> List; //TEST_TILE_TYPE, TEST_BPP, TEST_RESOURCE_TYPE, TestDimension index, TestArraySize index
    auto Size = BuildInputIterator(List, 4, 2);       // Send size of TestDimensions, TestArraySize

    for(auto element : List)
    {
        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Flags.Info           = {0};

        TEST_TILE_TYPE     Tiling     = (TEST_TILE_TYPE)std::get<0>(element);
        TEST_BPP           Bpp        = (TEST_BPP)std::get<1>(element);
        TEST_RESOURCE_TYPE ResType    = (TEST_RESOURCE_TYPE)std::get<2>(element);
        int                TestDimIdx = std::get<3>(element); //index into TestDimensions array
        int                ArrayIdx   = std::get<4>(element); //index into TestArraySize
        TileSize                      = (Tiling == TEST_TILEYS) ? GMM_KBYTE(64) : GMM_KBYTE(4);

        //Discard if un-supported Tiling/Res_type/bpp for this test
        if(Tiling < TEST_TILEY || !(Bpp == TEST_BPP_32 ||                         //Gen8: NO TileYs/Yf, CCS not supported for !TileY/Yf/Ys/X - gen8 support tilex
                                    Bpp == TEST_BPP_64 || Bpp == TEST_BPP_128) || //LRTC not supported on <32bpp
           ResType == TEST_RESOURCE_1D ||
           ResType == TEST_RESOURCE_BUFFER) //non-MSAA CCS, 1D is showing issues CCS becoming linear (Buffer is linear)
            continue;

        SetTileFlag(gmmParams, Tiling);
        SetResType(gmmParams, ResType);
        SetResGpuFlags(gmmParams, true); //Depth not Supported w/ CCS. Depth only has HiZ, and IMS
        SetResArraySize(gmmParams, TestArraySize[ArrayIdx]);

        gmmParams.NoGfxMemory = 1;
        gmmParams.Format      = SetResourceFormat(Bpp);

        GetAlignmentAndTileDimensionsForCCS(Bpp, Tiling, ResType,
                                            TileDimX, TileDimY, TileDimZ, WidthDivisor, HeightDivisor);

        gmmParams.BaseWidth64 = TestDimensions[TestDimIdx][0] * TileDimX + 0x1;
        gmmParams.BaseHeight  = (gmmParams.Type == RESOURCE_CUBE) ? gmmParams.BaseWidth64 :
                                                                   TestDimensions[TestDimIdx][1] * TileDimY + 0x1;
        gmmParams.Depth           = (gmmParams.Type == RESOURCE_3D) ? TestDimensions[TestDimIdx][2] * TileDimZ + 0x1 : 0x1;
        gmmParams.MSAA.NumSamples = 1;
        gmmParams.Flags.Gpu.CCS   = 0;

        //RT surface
        GMM_RESOURCE_INFO *RTResourceInfo;
        RTResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        //No CCS surface if RT creation failed
        if(RTResourceInfo)
        {
            gmmParams.Flags.Gpu.CCS = 1;
            GMM_RESOURCE_INFO *CCSResourceInfo;
            CCSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

            VerifyResourceHAlign<true>(CCSResourceInfo, RTHAlign); //Check if RT for CCS creation was aligned to CCS's RT alignment
            VerifyResourceVAlign<true>(CCSResourceInfo, RTVAlign);
            uint32_t ExpectedPitch = GMM_ULT_ALIGN((uint32_t)(GMM_ULT_ALIGN(gmmParams.BaseWidth64, RTHAlign) / WidthDivisor), CCSTileSize[0][0]);
            VerifyResourcePitch<true>(CCSResourceInfo, ExpectedPitch);
            VerifyResourcePitchInTiles<true>(CCSResourceInfo, ExpectedPitch / CCSTileSize[0][0]); // 1 tileY wide

            uint32_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, RTVAlign); // / HeightDivisor;
            if(gmmParams.ArraySize > 1 || gmmParams.Type == RESOURCE_CUBE || gmmParams.Type == RESOURCE_3D)
            {
                uint32_t DepthSlice = gmmParams.Depth;
                //if (gmmParams.Type == RESOURCE_3D && DepthSlice > 1)
                //{
                //    ExpectedQPitch *= DepthSlice;
                //}
                //else { // Should 3D surface Aux QPitch be distance between R-slices or not
                // If it must be R-slice distance, compute 3D QPitch, remove depthslice from arraysize
                VerifyResourceQPitch<true>(CCSResourceInfo, ExpectedQPitch); //verify false, else QPitch given for RT-size not CCS
                //}
                gmmParams.ArraySize *= (gmmParams.Type == RESOURCE_3D) ? DepthSlice : //3D R-slices
                                       (gmmParams.Type == RESOURCE_CUBE) ? 6 : 1;     //cube faces treated as array slices
            }

            ExpectedQPitch /= HeightDivisor;
            uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, CCSTileSize[0][1]);
            VerifyResourceSize<true>(CCSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, GMM_KBYTE(4)));

            pGmmULTClientContext->DestroyResInfoObject(CCSResourceInfo);
        } //CCS

        pGmmULTClientContext->DestroyResInfoObject(RTResourceInfo);
    } //Iterate through all input tuples

    // Mip-mapped case
}